

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  FlowNumber literal;
  ConstantInt *groupId;
  Value *pVVar2;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  RegExpGroupExpr *local_18;
  RegExpGroupExpr *expr_local;
  IRGenerator *this_local;
  
  local_18 = (RegExpGroupExpr *)CONCAT44(in_register_00000034,__fd);
  expr_local = (RegExpGroupExpr *)this;
  literal = RegExpGroupExpr::groupId(local_18);
  groupId = IRBuilder::get(&this->super_IRBuilder,literal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  pVVar2 = (Value *)IRBuilder::createRegExpGroup(&this->super_IRBuilder,groupId,&local_38);
  this->result_ = pVVar2;
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = std::allocator<char>::~allocator(&local_39);
  return iVar1;
}

Assistant:

void IRGenerator::accept(RegExpGroupExpr& expr) {
  result_ = createRegExpGroup(get(expr.groupId()));
}